

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

bool __thiscall Tester::testDirectory(Tester *this,string *path)

{
  bool bVar1;
  path *ppVar2;
  double __x;
  string local_198;
  path local_178;
  path local_138;
  directory_entry *local_f8;
  directory_entry *dir;
  undefined1 local_d8 [8];
  recursive_directory_iterator __end1;
  undefined1 local_a8 [8];
  recursive_directory_iterator __begin1;
  path local_80;
  recursive_directory_iterator local_40;
  recursive_directory_iterator *local_28;
  recursive_directory_iterator *__range1;
  string *psStack_18;
  int errorCount;
  string *path_local;
  Tester *this_local;
  
  __range1._4_4_ = 0;
  psStack_18 = path;
  path_local = (string *)this;
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&local_80,path);
  std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::
  recursive_directory_iterator(&local_40,&local_80);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_80);
  local_28 = &local_40;
  std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::
  recursive_directory_iterator((recursive_directory_iterator *)&__end1._M_options,local_28);
  std::experimental::filesystem::v1::__cxx11::begin
            ((recursive_directory_iterator *)local_a8,
             (recursive_directory_iterator *)&__end1._M_options);
  std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::
  ~recursive_directory_iterator((recursive_directory_iterator *)&__end1._M_options);
  std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::
  recursive_directory_iterator((recursive_directory_iterator *)&dir,local_28);
  std::experimental::filesystem::v1::__cxx11::end
            ((recursive_directory_iterator *)local_d8,(recursive_directory_iterator *)&dir);
  std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::
  ~recursive_directory_iterator((recursive_directory_iterator *)&dir);
  while (bVar1 = std::experimental::filesystem::v1::__cxx11::operator!=
                           ((recursive_directory_iterator *)local_a8,
                            (recursive_directory_iterator *)local_d8), bVar1) {
    local_f8 = (directory_entry *)
               std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::operator*
                         ((recursive_directory_iterator *)local_a8);
    ppVar2 = std::experimental::filesystem::v1::__cxx11::directory_entry::path(local_f8);
    std::experimental::filesystem::v1::__cxx11::path::extension(&local_138,ppVar2);
    std::experimental::filesystem::v1::__cxx11::path::
    path<char[6],std::experimental::filesystem::v1::__cxx11::path>(&local_178,(char (*) [6])".flow")
    ;
    bVar1 = std::experimental::filesystem::v1::__cxx11::operator==(&local_138,&local_178);
    std::experimental::filesystem::v1::__cxx11::path::~path(&local_178);
    std::experimental::filesystem::v1::__cxx11::path::~path(&local_138);
    if (bVar1) {
      flow::diagnostics::BufferedReport::clear(&this->report_);
      ppVar2 = std::experimental::filesystem::v1::__cxx11::directory_entry::path(local_f8);
      std::experimental::filesystem::v1::__cxx11::path::string(&local_198,ppVar2);
      bVar1 = testFile(this,&local_198);
      __x = (double)std::__cxx11::string::~string((string *)&local_198);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        flow::diagnostics::BufferedReport::log(&this->report_,__x);
        __range1._4_4_ = __range1._4_4_ + 1;
      }
    }
    std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::operator++
              ((recursive_directory_iterator *)local_a8);
  }
  std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::
  ~recursive_directory_iterator((recursive_directory_iterator *)local_d8);
  std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::
  ~recursive_directory_iterator((recursive_directory_iterator *)local_a8);
  std::experimental::filesystem::v1::__cxx11::recursive_directory_iterator::
  ~recursive_directory_iterator(&local_40);
  return __range1._4_4_ == 0;
}

Assistant:

bool Tester::testDirectory(const std::string& path) {
  int errorCount = 0;
  for (auto& dir : fs::recursive_directory_iterator(path)) {
    if (dir.path().extension() == ".flow") {
      report_.clear();
      if (!testFile(dir.path().string())) {
        report_.log();
        errorCount++;
      }
    }
  }

  return errorCount == 0;
}